

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  int iVar1;
  uint uVar2;
  
  if (((l->tt_ & 0xf) == 3) && ((r->tt_ & 0xf) == 3)) {
    iVar1 = LTnum(l,r);
    return iVar1;
  }
  if (((l->tt_ & 0xf) == 4) && ((r->tt_ & 0xf) == 4)) {
    uVar2 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
    return uVar2 >> 0x1f;
  }
  iVar1 = luaT_callorderTM(L,l,r,TM_LT);
  return iVar1;
}

Assistant:

int luaV_lessthan (lua_State *L, const TValue *l, const TValue *r) {
  if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
    return LTnum(l, r);
  else return lessthanothers(L, l, r);
}